

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

uint64_t aom_mse_wxh_16bit_highbd_c(uint16_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int j;
  ulong uVar5;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)w;
  if (w < 1) {
    uVar2 = uVar4;
  }
  uVar3 = (ulong)(uint)h;
  if (h < 1) {
    uVar3 = uVar4;
  }
  uVar1 = 0;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = uVar1 + ((uint)dst[uVar5] - (uint)src[uVar5]) * ((uint)dst[uVar5] - (uint)src[uVar5]);
    }
    src = src + sstride;
    dst = dst + dstride;
  }
  return uVar1;
}

Assistant:

uint64_t aom_mse_wxh_16bit_highbd_c(uint16_t *dst, int dstride, uint16_t *src,
                                    int sstride, int w, int h) {
  uint64_t sum = 0;
  for (int i = 0; i < h; i++) {
    for (int j = 0; j < w; j++) {
      int e = dst[i * dstride + j] - src[i * sstride + j];
      sum += e * e;
    }
  }
  return sum;
}